

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryScene(AssbinImporter *this,IOStream *stream,aiScene *scene)

{
  undefined1 auVar1 [16];
  uint uVar2;
  DeadlyImportError *this_00;
  ulong uVar3;
  aiMesh **ppaVar4;
  aiMesh *this_01;
  aiMaterial **ppaVar5;
  aiMaterial *this_02;
  aiAnimation **ppaVar6;
  aiAnimation *this_03;
  aiTexture **ppaVar7;
  aiTexture *this_04;
  aiLight **ppaVar8;
  aiLight *this_05;
  aiCamera **ppaVar9;
  aiCamera *this_06;
  uint local_70;
  uint local_6c;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  allocator<char> local_41;
  string local_40;
  aiScene *local_20;
  aiScene *scene_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = scene;
  scene_local = (aiScene *)stream;
  stream_local = (IOStream *)this;
  uVar2 = Read<unsigned_int>(stream);
  if (uVar2 == 0x1239) {
    Read<unsigned_int>((IOStream *)scene_local);
    uVar2 = Read<unsigned_int>((IOStream *)scene_local);
    local_20->mFlags = uVar2;
    uVar2 = Read<unsigned_int>((IOStream *)scene_local);
    local_20->mNumMeshes = uVar2;
    uVar2 = Read<unsigned_int>((IOStream *)scene_local);
    local_20->mNumMaterials = uVar2;
    uVar2 = Read<unsigned_int>((IOStream *)scene_local);
    local_20->mNumAnimations = uVar2;
    uVar2 = Read<unsigned_int>((IOStream *)scene_local);
    local_20->mNumTextures = uVar2;
    uVar2 = Read<unsigned_int>((IOStream *)scene_local);
    local_20->mNumLights = uVar2;
    uVar2 = Read<unsigned_int>((IOStream *)scene_local);
    local_20->mNumCameras = uVar2;
    ReadBinaryNode(this,(IOStream *)scene_local,&local_20->mRootNode,(aiNode *)0x0);
    if (local_20->mNumMeshes != 0) {
      auVar1 = ZEXT416(local_20->mNumMeshes) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar4 = (aiMesh **)operator_new__(uVar3);
      local_20->mMeshes = ppaVar4;
      memset(local_20->mMeshes,0,(ulong)local_20->mNumMeshes << 3);
      for (i_2 = 0; i_2 < local_20->mNumMeshes; i_2 = i_2 + 1) {
        this_01 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(this_01);
        local_20->mMeshes[i_2] = this_01;
        ReadBinaryMesh(this,(IOStream *)scene_local,local_20->mMeshes[i_2]);
      }
    }
    if (local_20->mNumMaterials != 0) {
      auVar1 = ZEXT416(local_20->mNumMaterials) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar5 = (aiMaterial **)operator_new__(uVar3);
      local_20->mMaterials = ppaVar5;
      memset(local_20->mMaterials,0,(ulong)local_20->mNumMaterials << 3);
      for (i_3 = 0; i_3 < local_20->mNumMaterials; i_3 = i_3 + 1) {
        this_02 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_02);
        local_20->mMaterials[i_3] = this_02;
        ReadBinaryMaterial(this,(IOStream *)scene_local,local_20->mMaterials[i_3]);
      }
    }
    if (local_20->mNumAnimations != 0) {
      auVar1 = ZEXT416(local_20->mNumAnimations) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar6 = (aiAnimation **)operator_new__(uVar3);
      local_20->mAnimations = ppaVar6;
      memset(local_20->mAnimations,0,(ulong)local_20->mNumAnimations << 3);
      for (i_4 = 0; i_4 < local_20->mNumAnimations; i_4 = i_4 + 1) {
        this_03 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_03);
        local_20->mAnimations[i_4] = this_03;
        ReadBinaryAnim(this,(IOStream *)scene_local,local_20->mAnimations[i_4]);
      }
    }
    if (local_20->mNumTextures != 0) {
      auVar1 = ZEXT416(local_20->mNumTextures) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar7 = (aiTexture **)operator_new__(uVar3);
      local_20->mTextures = ppaVar7;
      memset(local_20->mTextures,0,(ulong)local_20->mNumTextures << 3);
      for (i_5 = 0; i_5 < local_20->mNumTextures; i_5 = i_5 + 1) {
        this_04 = (aiTexture *)operator_new(0x428);
        aiTexture::aiTexture(this_04);
        local_20->mTextures[i_5] = this_04;
        ReadBinaryTexture(this,(IOStream *)scene_local,local_20->mTextures[i_5]);
      }
    }
    if (local_20->mNumLights != 0) {
      auVar1 = ZEXT416(local_20->mNumLights) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar8 = (aiLight **)operator_new__(uVar3);
      local_20->mLights = ppaVar8;
      memset(local_20->mLights,0,(ulong)local_20->mNumLights << 3);
      for (local_6c = 0; local_6c < local_20->mNumLights; local_6c = local_6c + 1) {
        this_05 = (aiLight *)operator_new(0x46c);
        aiLight::aiLight(this_05);
        local_20->mLights[local_6c] = this_05;
        ReadBinaryLight(this,(IOStream *)scene_local,local_20->mLights[local_6c]);
      }
    }
    if (local_20->mNumCameras != 0) {
      auVar1 = ZEXT416(local_20->mNumCameras) * ZEXT816(8);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      ppaVar9 = (aiCamera **)operator_new__(uVar3);
      local_20->mCameras = ppaVar9;
      memset(local_20->mCameras,0,(ulong)local_20->mNumCameras << 3);
      for (local_70 = 0; local_70 < local_20->mNumCameras; local_70 = local_70 + 1) {
        this_06 = (aiCamera *)operator_new(0x438);
        aiCamera::aiCamera(this_06);
        local_20->mCameras[local_70] = this_06;
        ReadBinaryCamera(this,(IOStream *)scene_local,local_20->mCameras[local_70]);
      }
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AssbinImporter::ReadBinaryScene( IOStream * stream, aiScene* scene ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AISCENE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    scene->mFlags         = Read<unsigned int>(stream);
    scene->mNumMeshes     = Read<unsigned int>(stream);
    scene->mNumMaterials  = Read<unsigned int>(stream);
    scene->mNumAnimations = Read<unsigned int>(stream);
    scene->mNumTextures   = Read<unsigned int>(stream);
    scene->mNumLights     = Read<unsigned int>(stream);
    scene->mNumCameras    = Read<unsigned int>(stream);

    // Read node graph
    //scene->mRootNode = new aiNode[1];
    ReadBinaryNode( stream, &scene->mRootNode, (aiNode*)NULL );

    // Read all meshes
    if (scene->mNumMeshes) {
        scene->mMeshes = new aiMesh*[scene->mNumMeshes];
        memset(scene->mMeshes, 0, scene->mNumMeshes*sizeof(aiMesh*));
        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            scene->mMeshes[i] = new aiMesh();
            ReadBinaryMesh( stream,scene->mMeshes[i]);
        }
    }

    // Read materials
    if (scene->mNumMaterials) {
        scene->mMaterials = new aiMaterial*[scene->mNumMaterials];
        memset(scene->mMaterials, 0, scene->mNumMaterials*sizeof(aiMaterial*));
        for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
            scene->mMaterials[i] = new aiMaterial();
            ReadBinaryMaterial(stream,scene->mMaterials[i]);
        }
    }

    // Read all animations
    if (scene->mNumAnimations) {
        scene->mAnimations = new aiAnimation*[scene->mNumAnimations];
        memset(scene->mAnimations, 0, scene->mNumAnimations*sizeof(aiAnimation*));
        for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
            scene->mAnimations[i] = new aiAnimation();
            ReadBinaryAnim(stream,scene->mAnimations[i]);
        }
    }

    // Read all textures
    if (scene->mNumTextures) {
        scene->mTextures = new aiTexture*[scene->mNumTextures];
        memset(scene->mTextures, 0, scene->mNumTextures*sizeof(aiTexture*));
        for (unsigned int i = 0; i < scene->mNumTextures;++i) {
            scene->mTextures[i] = new aiTexture();
            ReadBinaryTexture(stream,scene->mTextures[i]);
        }
    }

    // Read lights
    if (scene->mNumLights) {
        scene->mLights = new aiLight*[scene->mNumLights];
        memset(scene->mLights, 0, scene->mNumLights*sizeof(aiLight*));
        for (unsigned int i = 0; i < scene->mNumLights;++i) {
            scene->mLights[i] = new aiLight();
            ReadBinaryLight(stream,scene->mLights[i]);
        }
    }

    // Read cameras
    if (scene->mNumCameras) {
        scene->mCameras = new aiCamera*[scene->mNumCameras];
        memset(scene->mCameras, 0, scene->mNumCameras*sizeof(aiCamera*));
        for (unsigned int i = 0; i < scene->mNumCameras;++i) {
            scene->mCameras[i] = new aiCamera();
            ReadBinaryCamera(stream,scene->mCameras[i]);
        }
    }

}